

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_move_16_toc_i(void)

{
  uint uVar1;
  uint addr_in;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  addr_in = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar1 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
  m68ki_cpu.x_flag = uVar1 << 4 & 0x100;
  m68ki_cpu.n_flag = uVar1 << 4 & 0x80;
  m68ki_cpu.not_z_flag = (uint)((uVar1 & 4) == 0);
  m68ki_cpu.v_flag = (uVar1 & 2) << 6;
  m68ki_cpu.c_flag = (uVar1 & 1) << 8;
  return;
}

Assistant:

static void m68k_op_move_16_toc_i(void)
{
	m68ki_set_ccr(OPER_I_16());
}